

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void prvTidyAdjustTags(TidyDocImpl *doc)

{
  _DictHash *p_Var1;
  DictHash *pDVar2;
  Dict *np;
  Dict *pDVar3;
  uint i_2;
  long lVar4;
  uint i;
  
  pDVar3 = tag_defs + 1;
  while (pDVar3->id != TidyTag_A) {
    pDVar3 = pDVar3 + 1;
    if ((Dict *)((long)&tag_defs[0x96].next + 7) < pDVar3) goto LAB_0012f9c9;
  }
  pDVar3->parser = prvTidyParseInline;
  pDVar3->model = 0x10;
  lVar4 = 0;
  do {
    pDVar2 = (doc->tags).hashtab[lVar4];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
LAB_0012f9c9:
  pDVar3 = tag_defs + 1;
  while (pDVar3->id != TidyTag_CAPTION) {
    pDVar3 = pDVar3 + 1;
    if ((Dict *)((long)&tag_defs[0x96].next + 7) < pDVar3) goto LAB_0012fa2c;
  }
  pDVar3->parser = prvTidyParseInline;
  lVar4 = 0;
  do {
    pDVar2 = (doc->tags).hashtab[lVar4];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
LAB_0012fa2c:
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_OBJECT) {
      *(byte *)&pDVar3->model = (byte)pDVar3->model | 4;
      lVar4 = 0;
      do {
        pDVar2 = (doc->tags).hashtab[lVar4];
        while (pDVar2 != (DictHash *)0x0) {
          p_Var1 = pDVar2->next;
          (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
          pDVar2 = p_Var1;
        }
        (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xb2);
      return;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x97);
  return;
}

Assistant:

void TY_(AdjustTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseInline);
        np->model  = CM_INLINE;
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }

/*\
 * Issue #196
 * TidyTag_CAPTION allows %flow; in HTML5,
 * but only %inline; in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseInline);
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }

/*\
 * Issue #232
 * TidyTag_OBJECT not in head in HTML5,
 * but still allowed in HTML4
\*/
    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model |= CM_HEAD; /* add back allowed in head */
#if ELEMENT_HASH_LOOKUP
        tagsEmptyHash( doc, tags );
#endif
    }
}